

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  uint64_t *in_stack_00000028;
  uint64_t *in_stack_00000030;
  
  secp256k1_fe_sqr_inner(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
#ifdef VERIFY
    VERIFY_CHECK(a->magnitude <= 8);
    secp256k1_fe_verify(a);
#endif
    secp256k1_fe_sqr_inner(r->n, a->n);
#ifdef VERIFY
    r->magnitude = 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
#endif
}